

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O1

uint32_t __thiscall DISTRHO::PluginExporter::getVersion(PluginExporter *this)

{
  uint32_t uVar1;
  
  if (this->fPlugin == (Plugin *)0x0) {
    uVar1 = 0;
    d_stderr2("assertion failure: \"%s\" in file %s, line %i","fPlugin != nullptr",
              "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
              ,0x1d1);
  }
  else {
    uVar1 = (*this->fPlugin->_vptr_Plugin[8])();
  }
  return uVar1;
}

Assistant:

uint32_t getVersion() const noexcept
    {
        DISTRHO_SAFE_ASSERT_RETURN(fPlugin != nullptr, 0);

        return fPlugin->getVersion();
    }